

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O1

matrix<trng::GF2,_521UL> * __thiscall
trng::power<trng::GF2,521ul>
          (matrix<trng::GF2,_521UL> *__return_storage_ptr__,trng *this,matrix<trng::GF2,_521UL> *a,
          unsigned_long_long m)

{
  pointer pGVar1;
  bool bVar2;
  matrix<trng::GF2,_521UL> local_58;
  matrix<trng::GF2,_521UL> local_38;
  
  matrix<trng::GF2,521ul>::
  matrix<trng::power<trng::GF2,521ul>(trng::matrix<trng::GF2,521ul>const&,unsigned_long_long)::_lambda(unsigned_long,unsigned_long)_1_>
            ();
  std::vector<trng::GF2,_std::allocator<trng::GF2>_>::vector
            (&local_38.data,(vector<trng::GF2,_std::allocator<trng::GF2>_> *)this);
  if (a != (matrix<trng::GF2,_521UL> *)0x0) {
    do {
      if (((ulong)a & 1) != 0) {
        operator*(&local_58,__return_storage_ptr__,&local_38);
        pGVar1 = (__return_storage_ptr__->data).
                 super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pGVar1 != (pointer)0x0) {
          operator_delete(pGVar1);
        }
        if (local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (a == (matrix<trng::GF2,_521UL> *)0x1) break;
      operator*(&local_58,&local_38,&local_38);
      pGVar1 = local_38.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_38.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_38.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_38.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pGVar1 != (pointer)0x0) {
        operator_delete(pGVar1);
      }
      if (local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      bVar2 = a != (matrix<trng::GF2,_521UL> *)0x0;
      a = (matrix<trng::GF2,_521UL> *)((ulong)a >> 1);
    } while (bVar2);
  }
  if (local_38.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> power(const matrix<T, n> &a, unsigned long long m) {
    using matrix_type = matrix<T, n>;
    using size_type = typename matrix_type::size_type;

    auto unit = [&](size_type i, size_type j) -> T { return i == j ? T{1} : T{0}; };
    matrix_type res(unit);
    matrix_type powers(a);
    while (m > 0) {
      if ((m & 1ull) == 1ull)
        res = res * powers;
      m >>= 1u;
      if (m == 0)
        break;
      powers = powers * powers;
    }
    return res;
  }